

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::should_force_emit_builtin_block(CompilerGLSL *this,StorageClass storage)

{
  size_t sVar1;
  Variant *pVVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIRVariable *var;
  SPIRType *pSVar7;
  bool bVar8;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar9;
  uint32_t index;
  LoopLock local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  if (storage == StorageClassOutput) {
    ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
    sVar1 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar1 == 0) {
      bVar8 = false;
    }
    else {
      pTVar9 = (this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      local_38 = pTVar9 + sVar1;
      bVar8 = false;
      do {
        pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if ((pVVar2[pTVar9->id].type == TypeVariable) &&
           (var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + pTVar9->id), !bVar8)) {
          pSVar7 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)&(var->super_IVariant).field_0xc);
          bVar3 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                             DecorationBlock);
          if ((bVar3 && var->storage == StorageClassOutput) &&
             (bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar4)) {
            uVar6 = (uint32_t)
                    (pSVar7->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            if (uVar6 != 0) {
              index = 0;
              do {
                bVar3 = Compiler::has_member_decoration
                                  (&this->super_Compiler,(TypeID)(pSVar7->super_IVariant).self.id,
                                   index,DecorationBuiltIn);
                if ((((bVar3) &&
                     (uVar5 = Compiler::get_member_decoration
                                        (&this->super_Compiler,
                                         (TypeID)(pSVar7->super_IVariant).self.id,index,
                                         DecorationBuiltIn), uVar5 < 5)) && (uVar5 != 2)) &&
                   (bVar3 = Compiler::has_member_decoration
                                      (&this->super_Compiler,
                                       (TypeID)(pSVar7->super_IVariant).self.id,index,
                                       DecorationOffset), bVar3)) {
                  bVar8 = true;
                }
                index = index + 1;
              } while (uVar6 != index);
            }
          }
          else if (((!bVar3 && var->storage == StorageClassOutput) &&
                   (bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar3)) &&
                  ((uVar6 = Compiler::get_decoration
                                      (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                                       DecorationBuiltIn), uVar6 < 5 &&
                   ((uVar6 != 2 &&
                    (bVar3 = Compiler::has_decoration
                                       (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                        DecorationOffset), bVar3)))))) {
            bVar8 = true;
          }
        }
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != local_38);
    }
    ParsedIR::LoopLock::~LoopLock(&local_40);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool CompilerGLSL::should_force_emit_builtin_block(StorageClass storage)
{
	// If the builtin block uses XFB, we need to force explicit redeclaration of the builtin block.

	if (storage != StorageClassOutput)
		return false;
	bool should_force = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (should_force)
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (has_member_decoration(type.self, i, DecorationBuiltIn) &&
				    is_block_builtin(BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn))) &&
				    has_member_decoration(type.self, i, DecorationOffset))
				{
					should_force = true;
				}
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			if (is_block_builtin(BuiltIn(get_decoration(type.self, DecorationBuiltIn))) &&
			    has_decoration(var.self, DecorationOffset))
			{
				should_force = true;
			}
		}
	});

	return should_force;
}